

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentDensity.cpp
# Opt level: O2

void __thiscall OpenMD::CurrentDensity::process(CurrentDensity *this)

{
  SelectionManager *this_00;
  char cVar1;
  SimInfo *info;
  pointer pvVar2;
  long lVar3;
  AtomType *pAVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint i;
  ulong uVar11;
  double dVar12;
  int ii;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  Vector3d pos;
  StuntDouble *sd;
  Vector3d COMvel;
  Mat3x3d hmat;
  DumpReader reader;
  double local_1360;
  int local_1354;
  RealType local_1350;
  FixedChargeAdapter local_1348;
  SelectionEvaluator *local_1340;
  vector<double,_std::allocator<double>_> *local_1338;
  Thermo *local_1330;
  ulong local_1328;
  double local_1320;
  double local_1318;
  FluctuatingChargeAdapter local_1310;
  SelectionSet local_1308;
  StuntDouble *local_12f0;
  Vector3d local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar7 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar7 / (this->super_StaticAnalyser).step_;
  this->overallCurrentDensity_ = 0.0;
  local_1330 = &this->thermo_;
  local_1338 = &this->zBox_;
  local_1340 = &this->evaluator_;
  this_00 = &this->seleMan_;
  uVar11 = 0;
  while ((int)uVar11 < iVar7) {
    local_1328 = uVar11;
    DumpReader::readFrame(&local_1288,(int)uVar11);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    Thermo::getComVel(&local_12e8,local_1330);
    uVar9 = (this->super_StaticAnalyser).nBins_;
    pvVar2 = (this->sliceSDLists_).
             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; (ulong)uVar9 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
      lVar3 = *(long *)((long)&(pvVar2->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data + lVar8);
      if (*(long *)((long)&(pvVar2->
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           )._M_impl.super__Vector_impl_data + lVar8 + 8) != lVar3) {
        *(long *)((long)&(pvVar2->
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         )._M_impl.super__Vector_impl_data + lVar8 + 8) = lVar3;
      }
    }
    local_1350 = Snapshot::getVolume(this->currentSnapshot_);
    uVar9 = (this->super_StaticAnalyser).nBins_;
    Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1338,
               (value_type_conflict2 *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20));
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1308,local_1340);
      SelectionManager::setSelectionSet(this_00,&local_1308);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1308.bitsets_);
    }
    local_12f0 = SelectionManager::beginSelected(this_00,&local_1354);
    local_1320 = local_1350 / (double)uVar9;
    while (local_12f0 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_1308,local_12f0);
      if (cVar1 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1308);
        uVar9 = (this->super_StaticAnalyser).nBins_;
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                  ((this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (int)((uint)(int)(((double)(&local_1308.bitsets_.
                                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                ._M_impl.super__Vector_impl_data._M_start)
                                              [(uint)this->axis_] /
                                      *(double *)
                                       ((long)local_12d0.super_SquareMatrix<double,_3>.
                                              super_RectMatrix<double,_3U,_3U>.data_ +
                                       (ulong)(uint)this->axis_ * 0x20) + 0.5) * (double)uVar9) %
                        uVar9),&local_12f0);
      }
      local_12f0 = SelectionManager::nextSelected(this_00,&local_1354);
    }
    local_12f0 = (value_type)0x0;
    for (uVar11 = 0; uVar11 < (this->super_StaticAnalyser).nBins_; uVar11 = uVar11 + 1) {
      uVar9 = 0;
      dVar12 = 0.0;
      while( true ) {
        uVar10 = (ulong)uVar9;
        pvVar2 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = *(long *)&pvVar2[uVar11].
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar2[uVar11].
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar8 >> 3) <= uVar10)
        break;
        lVar8 = *(long *)(lVar8 + uVar10 * 8);
        if (*(uint *)(lVar8 + 8) < 2) {
          pAVar4 = *(AtomType **)(lVar8 + 0x78);
          local_1348.at_ = pAVar4;
          local_1318 = dVar12;
          bVar6 = FixedChargeAdapter::isFixedCharge(&local_1348);
          local_1360 = 0.0;
          if (bVar6) {
            local_1360 = FixedChargeAdapter::getCharge(&local_1348);
          }
          local_1310.at_ = pAVar4;
          bVar6 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1310);
          if (bVar6) {
            local_1360 = local_1360 +
                         *(double *)
                          (*(long *)(*(long *)(*(long *)(lVar8 + 0x18) + 0x18) + 0x150 +
                                    *(long *)(lVar8 + 0x10)) + (long)*(int *)(lVar8 + 0x30) * 8);
          }
          StuntDouble::getVel((Vector3d *)&local_1308,
                              *(StuntDouble **)
                               (*(long *)&(this->sliceSDLists_).
                                          super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                          ._M_impl.super__Vector_impl_data + uVar10 * 8));
          dVar12 = local_1318 +
                   local_1360 *
                   ((double)(&local_1308.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis_] -
                   local_12e8.super_Vector<double,_3U>.data_[(uint)this->axis_]);
        }
        uVar9 = uVar9 + 1;
      }
      pdVar5 = (this->currentDensity_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[uVar11] = dVar12 / local_1320 + pdVar5[uVar11];
      this->overallCurrentDensity_ = dVar12 / local_1350 + this->overallCurrentDensity_;
    }
    uVar11 = (ulong)(uint)((int)local_1328 + (this->super_StaticAnalyser).step_);
  }
  writeCurrentDensity(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void CurrentDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames            = reader.getNFrames();
    nProcessed_            = nFrames / step_;
    overallCurrentDensity_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d COMvel  = thermo_.getComVel();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType boxVolume   = currentSnapshot_->getVolume();
      RealType sliceVolume = boxVolume / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        int binNo;
        Vector3d pos = sd->getPos();

        if (usePeriodicBoundaryConditions_) {
          currentSnapshot_->wrapVector(pos);
          binNo =
              int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
          sliceSDLists_[binNo].push_back(sd);
        }
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binJc = 0;

        for (unsigned int j = 0; j < sliceSDLists_[i].size(); ++j) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][j]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][j]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) q = fca.getCharge();

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

            Vector3d vel = sliceSDLists_[i][j]->getVel();
            binJc += q * (vel[axis_] - COMvel[axis_]);
          }
        }

        // Units of (e / Ang^2 / fs)
        currentDensity_[i] += binJc / sliceVolume;
        overallCurrentDensity_ += binJc / boxVolume;
      }
    }

    writeCurrentDensity();
  }